

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

torrent_handle __thiscall libtorrent::aux::torrent::get_handle(torrent *this)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  torrent_handle tVar1;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::torrent,void>
            ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&_Stack_38,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xa0));
  ::std::__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<libtorrent::aux::torrent,void>(local_28,&_Stack_38);
  torrent_handle::torrent_handle
            ((torrent_handle *)this,(weak_ptr<libtorrent::aux::torrent> *)local_28);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_20);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  tVar1.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  tVar1.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (torrent_handle)
         tVar1.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

torrent_handle torrent::get_handle()
	{
		TORRENT_ASSERT(is_single_thread());
		return torrent_handle(shared_from_this());
	}